

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.h
# Opt level: O1

bool __thiscall Assimp::Q3Shader::ShaderDataBlock::operator==(ShaderDataBlock *this,string *o)

{
  char *__s1;
  char *__s2;
  int iVar1;
  bool bVar2;
  
  if ((int)(this->name)._M_string_length == (int)o->_M_string_length) {
    __s1 = (o->_M_dataplus)._M_p;
    if (__s1 == (char *)0x0) {
      __assert_fail("__null != s1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                    ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
    }
    __s2 = (this->name)._M_dataplus._M_p;
    if (__s2 == (char *)0x0) {
      __assert_fail("__null != s2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                    ,0x8b,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
    }
    iVar1 = strcasecmp(__s1,__s2);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator== (const std::string& o) const {
        return !ASSIMP_stricmp(o,name);
    }